

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduce.hpp
# Opt level: O1

void __thiscall
diy::detail::ReductionFunctor<Block,_diy::detail::KDTreePartners>::operator()
          (ReductionFunctor<Block,_diy::detail::KDTreePartners> *this,Block *b,ProxyWithLink *cp)

{
  KDTreePartners *this_00;
  int gid;
  pointer ppVar1;
  Master *m;
  bool bVar2;
  int iVar3;
  int iVar4;
  const_iterator __begin4;
  pointer pBVar5;
  BlockID target;
  vector<int,_std::allocator<int>_> outgoing_gids;
  vector<int,_std::allocator<int>_> incoming_gids;
  ReduceProxy rp;
  BlockID local_150;
  vector<int,_std::allocator<int>_> local_148;
  vector<int,_std::allocator<int>_> local_128;
  ReduceProxy local_108;
  
  this_00 = &this->partners;
  bVar2 = KDTreePartners::active
                    (this_00,this->round,(cp->super_Proxy).gid_,(cp->super_Proxy).master_);
  if (!bVar2) {
    return;
  }
  local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  if (0 < this->round) {
    KDTreePartners::incoming
              (this_00,this->round,(cp->super_Proxy).gid_,&local_128,(cp->super_Proxy).master_);
  }
  iVar4 = this->round;
  ppVar1 = (this->partners).rounds_.
           super__Vector_base<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  iVar3 = (int)((ulong)((long)(this->partners).rounds_.
                              super__Vector_base<std::pair<bool,_int>,_std::allocator<std::pair<bool,_int>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar1) >> 3);
  if (iVar3 <= iVar4) goto LAB_00168d72;
  gid = (cp->super_Proxy).gid_;
  if (iVar4 == iVar3) {
    iVar4 = ppVar1[(long)iVar4 + -1].second + 1;
  }
  else {
    m = (cp->super_Proxy).master_;
    if (ppVar1[iVar4].first != true) {
      RegularAllReducePartners::outgoing
                (&(this->partners).histogram,ppVar1[iVar4].second,gid,&local_148,m);
      goto LAB_00168d72;
    }
    iVar4 = ppVar1[iVar4].second;
    if (iVar4 < 0) {
      KDTreePartners::link_neighbors(this_00,-1,gid,&local_148,m);
      goto LAB_00168d72;
    }
  }
  RegularPartners::fill(&(this->partners).swap.super_RegularPartners,iVar4,gid,&local_148);
LAB_00168d72:
  ReduceProxy::ReduceProxy
            (&local_108,&cp->super_Proxy,b,this->round,this->assigner,&local_128,&local_148);
  local_150 = (BlockID)b;
  if ((this->reduce).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->reduce)._M_invoker)((_Any_data *)&this->reduce,(Block **)&local_150,&local_108,this_00)
    ;
    if ((local_108.super_Proxy.outgoing_._M_t._M_impl.super__Rb_tree_header._M_node_count <
         (ulong)(long)(int)((ulong)((long)local_108.out_link_.neighbors_.
                                          super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)local_108.out_link_.neighbors_.
                                         super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>
                                         ._M_impl.super__Vector_impl_data._M_start) >> 3)) &&
       (local_108.out_link_.neighbors_.
        super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_108.out_link_.neighbors_.
        super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
        super__Vector_impl_data._M_finish)) {
      pBVar5 = local_108.out_link_.neighbors_.
               super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
               super__Vector_impl_data._M_start;
      do {
        local_150 = *pBVar5;
        Catch::clara::std::
        map<diy::BlockID,_diy::MemoryBuffer,_std::less<diy::BlockID>,_std::allocator<std::pair<const_diy::BlockID,_diy::MemoryBuffer>_>_>
        ::operator[](&local_108.super_Proxy.outgoing_,&local_150);
        pBVar5 = pBVar5 + 1;
      } while (pBVar5 != local_108.out_link_.neighbors_.
                         super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    }
    local_108.out_link_.super_Factory<diy::Link>._vptr_Factory =
         (_func_int **)&PTR_id_abi_cxx11__001db5a0;
    if (local_108.out_link_.neighbors_.
        super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.out_link_.neighbors_.
                      super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_108.out_link_.neighbors_.
                            super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.out_link_.neighbors_.
                            super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    local_108.in_link_.super_Factory<diy::Link>._vptr_Factory =
         (_func_int **)&PTR_id_abi_cxx11__001db5a0;
    if (local_108.in_link_.neighbors_.
        super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.in_link_.neighbors_.
                      super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_108.in_link_.neighbors_.
                            super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.in_link_.neighbors_.
                            super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    Master::Proxy::~Proxy(&local_108.super_Proxy);
    if (local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_148.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
  std::__throw_bad_function_call();
}

Assistant:

void        operator()(Block* b, const Master::ProxyWithLink& cp) const
    {
      if (!partners.active(round, cp.gid(), *cp.master())) return;

      std::vector<int> incoming_gids, outgoing_gids;
      if (round > 0)
          partners.incoming(round, cp.gid(), incoming_gids, *cp.master());        // receive from the previous round
      if (round < static_cast<int>(partners.rounds()))
          partners.outgoing(round, cp.gid(), outgoing_gids, *cp.master());        // send to the next round

      ReduceProxy   rp(std::move(const_cast<Master::ProxyWithLink&>(cp)), b, round, assigner, incoming_gids, outgoing_gids);
      reduce(b, rp, partners);

      // touch the outgoing queues to make sure they exist
      Master::Proxy::OutgoingQueues& outgoing = *rp.outgoing();
      if (outgoing.size() < static_cast<size_t>(rp.out_link().size()))
        for (BlockID target : rp.out_link().neighbors())
          outgoing[target];       // touch the outgoing queue, creating it if necessary
    }